

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool IsValidVertexEdgeLink
               (ON_SubDVertex *vertex,ON_SubDEdge *edge,ON__UINT_PTR end_index,bool bSilentError)

{
  uchar uVar1;
  ON_SubDEdgeTag OVar2;
  bool bVar3;
  uint uVar4;
  double dVar5;
  ON_SubDSectorType st;
  ON_SubDSectorType local_50;
  
  if ((((vertex == (ON_SubDVertex *)0x0 || edge == (ON_SubDEdge *)0x0) ||
       (edge->m_vertex[end_index] != vertex)) ||
      (uVar1 = (vertex->super_ON_SubDComponentBase).m_level,
      uVar1 != (edge->super_ON_SubDComponentBase).m_level)) ||
     (((dVar5 = edge->m_sector_coefficient[end_index], dVar5 < 0.0 || (1.0 <= dVar5)) &&
      ((uVar1 != '\0' || ((dVar5 != -8883.0 || (NAN(dVar5))))))))) goto LAB_005d658a;
  OVar2 = edge->m_edge_tag;
  if (OVar2 != SmoothX) {
    if (OVar2 == Crease) {
      if ((((dVar5 == 0.0) && (!NAN(dVar5))) && (vertex->m_vertex_tag != Unset)) &&
         (vertex->m_vertex_tag != Smooth)) {
        return true;
      }
      goto LAB_005d658a;
    }
    if (OVar2 != Smooth) goto LAB_005d658a;
  }
  if (vertex->m_vertex_tag == Smooth) {
    if ((dVar5 != 0.0) || (NAN(dVar5))) goto LAB_005d658a;
  }
  else {
    uVar4 = ON_SubDEdge::TaggedEndIndex(edge);
    if (OVar2 == SmoothX) {
      if (uVar4 != 2) {
LAB_005d658a:
        bVar3 = ON_SubDIsNotValid(bSilentError);
        return bVar3;
      }
    }
    else if (uVar4 != (uint)end_index) goto LAB_005d658a;
    ON_SubDSectorType::Create(&local_50,edge,(uint)end_index);
    bVar3 = ON_SubDSectorType::IsValid(&local_50);
    if (((!bVar3) ||
        (dVar5 = ON_SubDSectorType::SectorCoefficient(&local_50),
        dVar5 != edge->m_sector_coefficient[end_index])) || ((dVar5 <= 0.0 || (1.0 <= dVar5)))) {
      bVar3 = ON_SubDIsNotValid(bSilentError);
      return bVar3;
    }
  }
  return true;
}

Assistant:

static bool IsValidVertexEdgeLink(
  const ON_SubDVertex* vertex,
  const ON_SubDEdge* edge,
  ON__UINT_PTR end_index,
  bool bSilentError
)
{
  if (nullptr == vertex || nullptr == edge)
    return ON_SubDIsNotValid(bSilentError);

  if (end_index > 1)
    return ON_SubDIsNotValid(bSilentError);

  if (edge->m_vertex[end_index] != vertex)
    return ON_SubDIsNotValid(bSilentError);

  if (vertex->SubdivisionLevel() != edge->SubdivisionLevel())
    return ON_SubDIsNotValid(bSilentError);

  if (false == EdgeSectorCoefficientIsValid(edge->m_sector_coefficient[end_index],edge))
    return ON_SubDIsNotValid(bSilentError);

  if ( edge->IsSmooth() )
  {
    // edge->m_edge_tag is ON_SubDEdgeTag::Smooth or ON_SubDEdgeTag::SmoothX
    if (ON_SubDVertexTag::Smooth == vertex->m_vertex_tag)
    {
      if (false == (0.0 == edge->m_sector_coefficient[end_index]))
        return ON_SubDIsNotValid(bSilentError);
    }
    else
    {
      const unsigned int tagged_end_index = edge->TaggedEndIndex();
      if (ON_SubDEdgeTag::SmoothX == edge->m_edge_tag)
      {
        if (2 != tagged_end_index)
          return ON_SubDIsNotValid(bSilentError);
      }
      else
      {
        if (tagged_end_index != (unsigned int)end_index)
          return ON_SubDIsNotValid(bSilentError);
      }
       
      ON_SubDSectorType st = ON_SubDSectorType::Create(edge,(unsigned int)end_index);
      if (!st.IsValid())
        return ON_SubDIsNotValid(bSilentError);

      const double expected_sector_coefficient = st.SectorCoefficient();
      if (false == (expected_sector_coefficient == edge->m_sector_coefficient[end_index]))
        return ON_SubDIsNotValid(bSilentError);

      if (false == EdgeSectorCoefficientIsSet(expected_sector_coefficient))
        return ON_SubDIsNotValid(bSilentError);
    }
  }
  else if(ON_SubDEdgeTag::Crease == edge->m_edge_tag)
  {
    // crease edge
    if (!(0.0 == edge->m_sector_coefficient[end_index]))
      return ON_SubDIsNotValid(bSilentError);

    if (ON_SubDVertexTag::Smooth == vertex->m_vertex_tag)
      return ON_SubDIsNotValid(bSilentError);

    if (ON_SubDVertexTag::Unset == vertex->m_vertex_tag)
      return ON_SubDIsNotValid(bSilentError);
  }
  else
  {
    return ON_SubDIsNotValid(bSilentError);
  }

  return true;
}